

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O2

void __thiscall
nanojson3::json::
json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::write_element(json_writer<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,js_string *val)

{
  output_stream *poVar1;
  string_view view;
  js_string_view val_00;
  string_view sVar2;
  char buf [32];
  
  if ((this->option_bits_ & debug_dump_type_as_comment) != default_option) {
    sVar2._M_str = "/***  STRING[";
    sVar2._M_len = 0xd;
    poVar1 = output_stream::operator<<(&this->output_,sVar2);
    sVar2 = integer_to_chars<32UL,_unsigned_long,_nullptr>(&buf,val->_M_string_length);
    poVar1 = output_stream::operator<<(poVar1,sVar2);
    view._M_str = "]  ***/ ";
    view._M_len = 8;
    output_stream::operator<<(poVar1,view);
  }
  val_00._M_str = (val->_M_dataplus)._M_p;
  val_00._M_len = val->_M_string_length;
  write_string(this,val_00);
  return;
}

Assistant:

void write_element(const js_string& val)
        {
            using namespace std::string_view_literals;
            if (has_option(json_serialize_option::debug_dump_type_as_comment))
            {
                char buf[32];
                output_ << "/***  STRING["sv << integer_to_chars(buf, val.size()) << "]  ***/ "sv;
            }

            write_string(val);
        }